

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

void PDHG_Compute_Dual_Infeasibility
               (CUPDLPwork *work,cupdlp_float *x,cupdlp_float *ax,cupdlp_float primalObj,
               cupdlp_float *dDualInfeasObj,cupdlp_float *dDualInfeasRes)

{
  CUPDLPproblem *pCVar1;
  CUPDLPresobj *pCVar2;
  CUPDLPscaling *pCVar3;
  double __x;
  cupdlp_float cVar4;
  cupdlp_float pScale;
  cupdlp_float pBoundLbResSq;
  cupdlp_float pConstrResSq;
  cupdlp_float pBoundUbResSq;
  cupdlp_float local_70;
  cupdlp_float local_68;
  cupdlp_float local_60;
  cupdlp_float local_58;
  cupdlp_float *local_50;
  CUPDLPscaling *local_48;
  cupdlp_float *local_40;
  cupdlp_float local_38;
  
  pCVar1 = work->problem;
  pCVar2 = work->resobj;
  local_48 = work->scaling;
  local_70 = 1.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_38 = 0.0;
  local_58 = primalObj;
  local_50 = ax;
  local_40 = dDualInfeasRes;
  memcpy(pCVar2->primalInfeasRay,x,(long)pCVar1->data->nCols << 3);
  cupdlp_twoNorm(work,pCVar1->data->nCols,pCVar2->primalInfeasRay,&local_70);
  if (local_70 < 1e-08) {
    local_70 = 1.0;
  }
  cupdlp_scaleVector(work,1.0 / local_70,pCVar2->primalInfeasRay,pCVar1->data->nCols);
  *dDualInfeasObj = ((local_58 - pCVar1->offset) / pCVar1->sense_origin) / local_70;
  memcpy(pCVar2->primalInfeasConstr,local_50,(long)pCVar1->data->nRows << 3);
  cupdlp_scaleVector(work,1.0 / local_70,pCVar2->primalInfeasConstr,pCVar1->data->nRows);
  cupdlp_projNeg(pCVar2->primalInfeasConstr + pCVar1->nEqs,pCVar1->data->nRows - pCVar1->nEqs);
  pCVar3 = local_48;
  if (local_48->ifScaled != 0) {
    cupdlp_edot(pCVar2->primalInfeasConstr,work->rowScale,pCVar1->data->nRows);
  }
  cupdlp_twoNormSquared(work,pCVar1->data->nRows,pCVar2->primalInfeasConstr,&local_60);
  memcpy(pCVar2->primalInfeasBound,pCVar2->primalInfeasRay,(long)pCVar1->data->nCols << 3);
  cupdlp_projNeg(pCVar2->primalInfeasBound,pCVar1->data->nCols);
  cupdlp_edot(pCVar2->primalInfeasBound,pCVar1->hasLower,pCVar1->data->nCols);
  if (pCVar3->ifScaled != 0) {
    cupdlp_ediv(pCVar2->primalInfeasBound,work->colScale,pCVar1->data->nCols);
  }
  cupdlp_twoNormSquared(work,pCVar1->data->nCols,pCVar2->primalInfeasBound,&local_68);
  memcpy(pCVar2->primalInfeasBound,pCVar2->primalInfeasRay,(long)pCVar1->data->nCols << 3);
  cupdlp_projPos(pCVar2->primalInfeasBound,pCVar1->data->nCols);
  cupdlp_edot(pCVar2->primalInfeasBound,pCVar1->hasUpper,pCVar1->data->nCols);
  if (pCVar3->ifScaled != 0) {
    cupdlp_ediv(pCVar2->primalInfeasBound,work->colScale,pCVar1->data->nCols);
  }
  cupdlp_twoNormSquared(work,pCVar1->data->nCols,pCVar2->primalInfeasBound,&local_38);
  __x = local_60 + local_68 + local_38;
  if (__x < 0.0) {
    cVar4 = sqrt(__x);
  }
  else {
    cVar4 = SQRT(__x);
  }
  *local_40 = cVar4;
  return;
}

Assistant:

void PDHG_Compute_Dual_Infeasibility(CUPDLPwork *work, const cupdlp_float *x,
                                     const cupdlp_float *ax,
                                     const cupdlp_float primalObj,
                                     cupdlp_float *dDualInfeasObj,
                                     cupdlp_float *dDualInfeasRes) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPscaling *scaling = work->scaling;
  cupdlp_float pScale = 1.0;
  cupdlp_float pConstrResSq = 0.0;
  cupdlp_float pBoundLbResSq = 0.0;
  cupdlp_float pBoundUbResSq = 0.0;

  #if !defined(CUPDLP_CPU) && USE_KERNELS
  // x ray
  cupdlp_twoNorm(work, problem->data->nCols, x, &pScale);
  // pScale /= sqrt(problem->data->nCols);
  if (pScale < 1e-8) {
    pScale = 1.0;
  }

  // primal obj
  *dDualInfeasObj =
      (primalObj - problem->offset) / problem->sense_origin / pScale;

  // primal constraints [Ax, min(Gx, 0)]
  cupdlp_dual_infeasibility_kernel_constr_cuda(work->buffer2, ax,
                                              work->rowScale, 1.0 / pScale,
                                              scaling->ifScaled,
                                              problem->nEqs,
                                              problem->data->nRows);
  cupdlp_twoNormSquared(work, problem->data->nRows, work->buffer2,
                        &pConstrResSq);

  // primal bound
  // lb
  cupdlp_dual_infeasibility_kernel_lb_cuda(work->buffer2, x,
                                           problem->hasLower,
                                           work->colScale,
                                           1.0 / pScale, scaling->ifScaled,
                                           problem->data->nCols);
  cupdlp_twoNormSquared(work, problem->data->nCols, work->buffer2,
                        &pBoundLbResSq);
  // ub
  cupdlp_dual_infeasibility_kernel_ub_cuda(work->buffer2, x,
                                           problem->hasUpper,
                                           work->colScale,
                                           1.0 / pScale, scaling->ifScaled,
                                           problem->data->nCols);
  cupdlp_twoNormSquared(work, problem->data->nCols, work->buffer2,
                        &pBoundUbResSq);

  // sum up
  *dDualInfeasRes = sqrt(pConstrResSq + pBoundLbResSq + pBoundUbResSq);

#else

  // x ray
  CUPDLP_COPY_VEC(resobj->primalInfeasRay, x, cupdlp_float,
                  problem->data->nCols);
  cupdlp_twoNorm(work, problem->data->nCols, resobj->primalInfeasRay, &pScale);
  // pScale /= sqrt(problem->data->nCols);
  if (pScale < 1e-8) {
    pScale = 1.0;
  }
  cupdlp_scaleVector(work, 1.0 / pScale, resobj->primalInfeasRay,
                     problem->data->nCols);

  // primal obj
  *dDualInfeasObj =
      (primalObj - problem->offset) / problem->sense_origin / pScale;

  // primal constraints [Ax, min(Gx, 0)]
  CUPDLP_COPY_VEC(resobj->primalInfeasConstr, ax, cupdlp_float,
                  problem->data->nRows);
  cupdlp_scaleVector(work, 1.0 / pScale, resobj->primalInfeasConstr,
                     problem->data->nRows);
  cupdlp_projNeg(resobj->primalInfeasConstr + problem->nEqs,
                 problem->data->nRows - problem->nEqs);
  if (scaling->ifScaled) {
    cupdlp_edot(resobj->primalInfeasConstr, work->rowScale,
                problem->data->nRows);
  }
  cupdlp_twoNormSquared(work, problem->data->nRows, resobj->primalInfeasConstr,
                        &pConstrResSq);

  // primal bound
  // lb
  CUPDLP_COPY_VEC(resobj->primalInfeasBound, resobj->primalInfeasRay,
                  cupdlp_float, problem->data->nCols);
  cupdlp_projNeg(resobj->primalInfeasBound, problem->data->nCols);
  cupdlp_edot(resobj->primalInfeasBound, problem->hasLower,
              problem->data->nCols);
  if (scaling->ifScaled) {
    cupdlp_ediv(resobj->primalInfeasBound, work->colScale,
                problem->data->nCols);
  }
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->primalInfeasBound,
                        &pBoundLbResSq);
  // ub
  CUPDLP_COPY_VEC(resobj->primalInfeasBound, resobj->primalInfeasRay,
                  cupdlp_float, problem->data->nCols);
  cupdlp_projPos(resobj->primalInfeasBound, problem->data->nCols);
  cupdlp_edot(resobj->primalInfeasBound, problem->hasUpper,
              problem->data->nCols);
  if (scaling->ifScaled) {
    cupdlp_ediv(resobj->primalInfeasBound, work->colScale,
                problem->data->nCols);
  }
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->primalInfeasBound,
                        &pBoundUbResSq);

  // sum up
  *dDualInfeasRes = sqrt(pConstrResSq + pBoundLbResSq + pBoundUbResSq);

#endif
}